

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseCharDataComplex(xmlParserCtxtPtr ctxt,int partial)

{
  int iVar1;
  bool local_15e;
  int local_154;
  int local_150;
  int l;
  int cur;
  int nbchar;
  xmlChar buf [305];
  int partial_local;
  xmlParserCtxtPtr ctxt_local;
  
  l = 0;
  buf._300_4_ = partial;
  unique0x100003ef = ctxt;
  local_150 = xmlCurrentCharRecover(ctxt,&local_154);
  while( true ) {
    local_15e = false;
    if (((local_150 != 0x3c) && (local_15e = false, local_150 != 0x26)) &&
       ((buf._300_4_ == 0 ||
        ((local_150 != 0x5d ||
         (local_15e = false,
         1 < (long)stack0xfffffffffffffff0->input->end - (long)stack0xfffffffffffffff0->input->cur))
        )))) {
      if (local_150 < 0x100) {
        if (((local_150 < 9) || (local_15e = true, 10 < local_150)) &&
           (local_15e = true, local_150 != 0xd)) {
          local_15e = 0x1f < local_150;
        }
      }
      else if (((local_150 < 0x100) || (local_15e = true, 0xd7ff < local_150)) &&
              ((local_150 < 0xe000 || (local_15e = true, 0xfffd < local_150)))) {
        local_15e = 0xffff < local_150 && local_150 < 0x110000;
      }
    }
    if (!local_15e) break;
    if (((local_150 == 0x5d) && (stack0xfffffffffffffff0->input->cur[1] == ']')) &&
       (stack0xfffffffffffffff0->input->cur[2] == '>')) {
      xmlFatalErr(stack0xfffffffffffffff0,XML_ERR_MISPLACED_CDATA_END,(char *)0x0);
    }
    if (local_150 < 0x80) {
      *(char *)((long)&cur + (long)l) = (char)local_150;
      l = l + 1;
    }
    else {
      iVar1 = xmlCopyCharMultiByte((xmlChar *)((long)&cur + (long)l),local_150);
      l = iVar1 + l;
    }
    if (*stack0xfffffffffffffff0->input->cur == '\n') {
      stack0xfffffffffffffff0->input->line = stack0xfffffffffffffff0->input->line + 1;
      stack0xfffffffffffffff0->input->col = 1;
    }
    else {
      stack0xfffffffffffffff0->input->col = stack0xfffffffffffffff0->input->col + 1;
    }
    stack0xfffffffffffffff0->input->cur = stack0xfffffffffffffff0->input->cur + local_154;
    if (299 < l) {
      *(undefined1 *)((long)&cur + (long)l) = 0;
      xmlCharacters(stack0xfffffffffffffff0,(xmlChar *)&cur,l);
      l = 0;
      if ((stack0xfffffffffffffff0->input->flags & 0x40U) == 0) {
        xmlParserShrink(stack0xfffffffffffffff0);
      }
    }
    local_150 = xmlCurrentCharRecover(stack0xfffffffffffffff0,&local_154);
  }
  if (l != 0) {
    *(undefined1 *)((long)&cur + (long)l) = 0;
    xmlCharacters(stack0xfffffffffffffff0,(xmlChar *)&cur,l);
  }
  if (stack0xfffffffffffffff0->input->cur < stack0xfffffffffffffff0->input->end) {
    if ((local_150 == 0) && (*stack0xfffffffffffffff0->input->cur != '\0')) {
      if (buf._300_4_ == 0) {
        xmlFatalErrMsgInt(stack0xfffffffffffffff0,XML_ERR_INVALID_CHAR,
                          "Incomplete UTF-8 sequence starting with %02X\n",
                          (uint)*stack0xfffffffffffffff0->input->cur);
        if (*stack0xfffffffffffffff0->input->cur == '\n') {
          stack0xfffffffffffffff0->input->line = stack0xfffffffffffffff0->input->line + 1;
          stack0xfffffffffffffff0->input->col = 1;
        }
        else {
          stack0xfffffffffffffff0->input->col = stack0xfffffffffffffff0->input->col + 1;
        }
        stack0xfffffffffffffff0->input->cur = stack0xfffffffffffffff0->input->cur + 1;
      }
    }
    else if ((local_150 != 0x3c) && ((local_150 != 0x26 && (local_150 != 0x5d)))) {
      xmlFatalErrMsgInt(stack0xfffffffffffffff0,XML_ERR_INVALID_CHAR,
                        "PCDATA invalid Char value %d\n",local_150);
      if (*stack0xfffffffffffffff0->input->cur == '\n') {
        stack0xfffffffffffffff0->input->line = stack0xfffffffffffffff0->input->line + 1;
        stack0xfffffffffffffff0->input->col = 1;
      }
      else {
        stack0xfffffffffffffff0->input->col = stack0xfffffffffffffff0->input->col + 1;
      }
      stack0xfffffffffffffff0->input->cur = stack0xfffffffffffffff0->input->cur + local_154;
    }
  }
  return;
}

Assistant:

static void
xmlParseCharDataComplex(xmlParserCtxtPtr ctxt, int partial) {
    xmlChar buf[XML_PARSER_BIG_BUFFER_SIZE + 5];
    int nbchar = 0;
    int cur, l;

    cur = xmlCurrentCharRecover(ctxt, &l);
    while ((cur != '<') && /* checked */
           (cur != '&') &&
           ((!partial) || (cur != ']') ||
            (ctxt->input->end - ctxt->input->cur >= 2)) &&
	   (IS_CHAR(cur))) {
	if ((cur == ']') && (NXT(1) == ']') && (NXT(2) == '>')) {
	    xmlFatalErr(ctxt, XML_ERR_MISPLACED_CDATA_END, NULL);
	}
	COPY_BUF(buf, nbchar, cur);
	/* move current position before possible calling of ctxt->sax->characters */
	NEXTL(l);
	if (nbchar >= XML_PARSER_BIG_BUFFER_SIZE) {
	    buf[nbchar] = 0;

            xmlCharacters(ctxt, buf, nbchar);
	    nbchar = 0;
            SHRINK;
	}
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    if (nbchar != 0) {
        buf[nbchar] = 0;

        xmlCharacters(ctxt, buf, nbchar);
    }
    /*
     * cur == 0 can mean
     *
     * - End of buffer.
     * - An actual 0 character.
     * - An incomplete UTF-8 sequence. This is allowed if partial is set.
     */
    if (ctxt->input->cur < ctxt->input->end) {
        if ((cur == 0) && (CUR != 0)) {
            if (partial == 0) {
                xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                        "Incomplete UTF-8 sequence starting with %02X\n", CUR);
                NEXTL(1);
            }
        } else if ((cur != '<') && (cur != '&') && (cur != ']')) {
            /* Generate the error and skip the offending character */
            xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                              "PCDATA invalid Char value %d\n", cur);
            NEXTL(l);
        }
    }
}